

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerReflection::emit_type_member_qualifiers
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID *this_00;
  mapped_type *pmVar3;
  ulong uVar4;
  size_t sVar5;
  TypedID<(spirv_cross::Types)1> *pTVar6;
  element_type *peVar7;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  ID local_c0;
  allocator local_b9;
  string local_b8 [32];
  ID local_98;
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  Decoration *local_38;
  Decoration *dec;
  Vector<Decoration> *memb;
  SPIRType *membertype;
  SPIRType *pSStack_18;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerReflection *this_local;
  
  membertype._4_4_ = index;
  pSStack_18 = type;
  type_local = (SPIRType *)this;
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      (&(type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,(ulong)index)
  ;
  uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
  memb = (Vector<Decoration> *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  emit_type_array(this,(SPIRType *)memb);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(pSStack_18->super_IVariant).self);
  dec = (Decoration *)&pmVar3->members;
  uVar4 = (ulong)membertype._4_4_;
  sVar5 = VectorView<spirv_cross::Meta::Decoration>::size
                    ((VectorView<spirv_cross::Meta::Decoration> *)dec);
  if (uVar4 < sVar5) {
    local_38 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                         ((VectorView<spirv_cross::Meta::Decoration> *)dec,(ulong)membertype._4_4_);
    bVar1 = Bitset::get(&local_38->decoration_flags,0x1e);
    if (bVar1) {
      peVar7 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"location",&local_59);
      simple_json::Stream::emit_json_key_value(peVar7,(string *)local_58,local_38->location);
      ::std::__cxx11::string::~string(local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    bVar1 = Bitset::get(&local_38->decoration_flags,0x23);
    if (bVar1) {
      peVar7 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_90,"offset",&local_91);
      simple_json::Stream::emit_json_key_value(peVar7,(string *)local_90,local_38->offset);
      ::std::__cxx11::string::~string(local_90);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       (&(pSStack_18->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                        (ulong)membertype._4_4_);
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>(&local_98,pTVar6);
    bVar1 = Compiler::has_decoration((Compiler *)this,local_98,DecorationArrayStride);
    if (bVar1) {
      peVar7 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"array_stride",&local_b9);
      pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                         (&(pSStack_18->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                          (ulong)membertype._4_4_);
      TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>(&local_c0,pTVar6);
      uVar2 = Compiler::get_decoration((Compiler *)this,local_c0,DecorationArrayStride);
      simple_json::Stream::emit_json_key_value(peVar7,(string *)local_b8,uVar2);
      ::std::__cxx11::string::~string(local_b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    bVar1 = Bitset::get(&local_38->decoration_flags,7);
    if (bVar1) {
      peVar7 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e0,"matrix_stride",&local_e1);
      simple_json::Stream::emit_json_key_value(peVar7,(string *)local_e0,local_38->matrix_stride);
      ::std::__cxx11::string::~string(local_e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    bVar1 = Bitset::get(&local_38->decoration_flags,4);
    if (bVar1) {
      peVar7 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_108,"row_major",&local_109);
      simple_json::Stream::emit_json_key_value(peVar7,(string *)local_108,true);
      ::std::__cxx11::string::~string(local_108);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    bVar1 = Compiler::type_is_top_level_physical_pointer((Compiler *)this,(SPIRType *)memb);
    if (bVar1) {
      peVar7 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_130,"physical_pointer",&local_131);
      simple_json::Stream::emit_json_key_value(peVar7,(string *)local_130,true);
      ::std::__cxx11::string::~string(local_130);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    }
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_member_qualifiers(const SPIRType &type, uint32_t index)
{
	auto &membertype = get<SPIRType>(type.member_types[index]);
	emit_type_array(membertype);
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
	{
		auto &dec = memb[index];
		if (dec.decoration_flags.get(DecorationLocation))
			json_stream->emit_json_key_value("location", dec.location);
		if (dec.decoration_flags.get(DecorationOffset))
			json_stream->emit_json_key_value("offset", dec.offset);

		// Array stride is a property of the array type, not the struct.
		if (has_decoration(type.member_types[index], DecorationArrayStride))
			json_stream->emit_json_key_value("array_stride",
			                                 get_decoration(type.member_types[index], DecorationArrayStride));

		if (dec.decoration_flags.get(DecorationMatrixStride))
			json_stream->emit_json_key_value("matrix_stride", dec.matrix_stride);
		if (dec.decoration_flags.get(DecorationRowMajor))
			json_stream->emit_json_key_value("row_major", true);

		if (type_is_top_level_physical_pointer(membertype))
			json_stream->emit_json_key_value("physical_pointer", true);
	}
}